

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RP5C01.cpp
# Opt level: O0

ssize_t __thiscall Ricoh::RP5C01::RP5C01::read(RP5C01 *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  int local_24;
  uint local_20;
  int hours;
  int value;
  int address_local;
  RP5C01 *this_local;
  
  uVar1 = __fd & 0xf;
  if ((uVar1 < 0xd) && (1 < this->mode_)) {
    iVar2 = 0;
    if (this->mode_ == 3) {
      iVar2 = 0xd;
    }
    pbVar3 = std::array<unsigned_char,_26UL>::operator[](&this->ram_,(long)(int)(iVar2 + uVar1));
    local_20 = *pbVar3 | 0xf0;
    this_local._7_1_ = (undefined1)local_20;
  }
  else {
    local_20 = 0xf;
    iVar2 = anon_unknown.dwarf_4b0d39::Reg(this->mode_,uVar1);
    switch(iVar2) {
    case 0:
      local_20 = Numeric::NumericCoder<10,_6,_10,_6,_24>::decode<0>(this->seconds_);
      break;
    case 1:
      local_20 = Numeric::NumericCoder<10,_6,_10,_6,_24>::decode<1>(this->seconds_);
      break;
    case 2:
      local_20 = Numeric::NumericCoder<10,_6,_10,_6,_24>::decode<2>(this->seconds_);
      break;
    case 3:
      local_20 = Numeric::NumericCoder<10,_6,_10,_6,_24>::decode<3>(this->seconds_);
      break;
    case 4:
    case 5:
      local_24 = Numeric::NumericCoder<10,_6,_10,_6,_24>::decode<4>(this->seconds_);
      if ((this->twentyfour_hour_clock_ & 1U) == 0) {
        local_24 = anon_unknown.dwarf_4b0d39::twenty_four_to_twelve(local_24);
      }
      if (uVar1 == 4) {
        local_20 = Numeric::NumericCoder<10,_10>::decode<0>(local_24);
      }
      else {
        local_20 = Numeric::NumericCoder<10,_10>::decode<1>(local_24);
      }
      break;
    case 6:
      local_20 = this->day_of_the_week_;
      break;
    case 7:
      local_20 = Numeric::NumericCoder<10,_10>::decode<0>(this->day_);
      break;
    case 8:
      local_20 = Numeric::NumericCoder<10,_10>::decode<1>(this->day_);
      break;
    case 9:
      local_20 = Numeric::NumericCoder<10,_10>::decode<0>(this->month_ + 1);
      break;
    case 10:
      local_20 = Numeric::NumericCoder<10,_10>::decode<1>(this->month_ + 1);
      break;
    case 0xb:
      local_20 = Numeric::NumericCoder<10,_10>::decode<0>(this->year_);
      break;
    case 0xc:
      local_20 = Numeric::NumericCoder<10,_10>::decode<1>(this->year_);
      break;
    case 0xd:
    case 0x1d:
    case 0x2d:
    case 0x3d:
      uVar1 = 0;
      if ((this->timer_enabled_ & 1U) != 0) {
        uVar1 = 8;
      }
      uVar4 = 0;
      if ((this->alarm_enabled_ & 1U) != 0) {
        uVar4 = 4;
      }
      local_20 = uVar1 | uVar4 | this->mode_;
      break;
    case 0xe:
    case 0x1e:
    case 0x2e:
    case 0x3e:
      break;
    case 0xf:
    case 0x1f:
    case 0x2f:
    case 0x3f:
      local_20 = 8;
      if ((this->one_hz_on_ & 1U) != 0) {
        local_20 = 0;
      }
      uVar1 = 4;
      if ((this->sixteen_hz_on_ & 1U) != 0) {
        uVar1 = 0;
      }
      local_20 = local_20 | uVar1;
      break;
    case 0x12:
    case 0x13:
      break;
    case 0x14:
    case 0x15:
      break;
    case 0x16:
      break;
    case 0x17:
    case 0x18:
      break;
    case 0x1a:
      local_20 = (uint)(this->twentyfour_hour_clock_ & 1);
      break;
    case 0x1b:
      local_20 = this->leap_year_;
    }
    local_20 = local_20 | 0xf0;
    this_local._7_1_ = (undefined1)local_20;
  }
  return (ulong)CONCAT31((int3)(local_20 >> 8),this_local._7_1_);
}

Assistant:

uint8_t RP5C01::read(int address) {
	address &= 0xf;

	if(address < 0xd && mode_ >= 2) {
		address += mode_ == 3 ? 13 : 0;
		return 0xf0 | ram_[size_t(address)];
	}

	int value = 0xf;
	switch(Reg(mode_, address)) {
		// Second.
		case Reg(0, 0x00):	value = SecondEncoder::decode<0>(seconds_);	break;
		case Reg(0, 0x01):	value = SecondEncoder::decode<1>(seconds_);	break;

		// Minute.
		case Reg(0, 0x02):	value = SecondEncoder::decode<2>(seconds_);	break;
		case Reg(0, 0x03):	value = SecondEncoder::decode<3>(seconds_);	break;

		// Hour.
		case Reg(0, 0x04):
		case Reg(0, 0x05): {
			int hours = SecondEncoder::decode<4>(seconds_);
			if(!twentyfour_hour_clock_) {
				hours = twenty_four_to_twelve(hours);
			}
			if(address == 0x4) {
				value = TwoDigitEncoder::decode<0>(hours);
			} else {
				value = TwoDigitEncoder::decode<1>(hours);
			}
		} break;

		// Day-of-the-week.
		case Reg(0, 0x06):	value = day_of_the_week_;	break;

		// Day.
		case Reg(0, 0x07):	value = TwoDigitEncoder::decode<0>(day_);		break;
		case Reg(0, 0x08):	value = TwoDigitEncoder::decode<1>(day_);		break;

		// Month.
		case Reg(0, 0x09):	value = TwoDigitEncoder::decode<0>(month_ + 1);	break;
		case Reg(0, 0x0a):	value = TwoDigitEncoder::decode<1>(month_ + 1);	break;

		// Year.
		case Reg(0, 0x0b):	value = TwoDigitEncoder::decode<0>(year_);		break;
		case Reg(0, 0x0c):	value = TwoDigitEncoder::decode<1>(year_);		break;

		// TODO: alarm minutes.
		case Reg(1, 0x02):
		case Reg(1, 0x03):	break;

		// TODO: alarm hours.
		case Reg(1, 0x04):
		case Reg(1, 0x05):	break;

		// TODO: alarm day-of-the-week.
		case Reg(1, 0x06):	break;

		// TODO: alarm day.
		case Reg(1, 0x07):
		case Reg(1, 0x08):	break;

		// 12/24-hour clock.
		case Reg(1, 0x0a):	value = twentyfour_hour_clock_;	break;

		// Leap year.
		case Reg(1, 0x0b):	value = leap_year_;				break;

		//
		// Registers D–F don't depend on the mode.
		//

		case Reg(0, 0xd):	case Reg(1, 0xd):	case Reg(2, 0xd):	case Reg(3, 0xd):
			value =
				(timer_enabled_ ? 0x8 : 0x0) |
				(alarm_enabled_ ? 0x4 : 0x0) |
				mode_;
		break;
		case Reg(0, 0xe):	case Reg(1, 0xe):	case Reg(2, 0xe):	case Reg(3, 0xe):
			// Test register; unclear what is supposed to happen.
		break;
		case Reg(0, 0xf):	case Reg(1, 0xf):	case Reg(2, 0xf):	case Reg(3, 0xf):
			value =
				(one_hz_on_ ? 0x0 : 0x8) |
				(sixteen_hz_on_ ? 0x0 : 0x4);
		break;
	}

	return uint8_t(0xf0 | value);
}